

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> __thiscall
duckdb::SecretManager::CreateSecret
          (SecretManager *this,ClientContext *context,CreateSecretInput *input)

{
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  pointer __p;
  CreateSecretFunction *pCVar1;
  InternalException *this_00;
  CreateSecretInput *in_RCX;
  allocator local_1f1;
  element_type *local_1f0;
  undefined1 local_1e8 [8];
  optional_ptr<duckdb::CreateSecretFunction,_true> function_lookup;
  CatalogTransaction transaction;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  SecretType secret_type;
  CreateSecretInput function_input;
  
  CatalogTransaction::GetSystemCatalogTransaction(&transaction,(ClientContext *)input);
  transaction_00.context.ptr = transaction.context.ptr;
  transaction_00.db.ptr = transaction.db.ptr;
  transaction_00.transaction.ptr = transaction.transaction.ptr;
  transaction_00.transaction_id = transaction.transaction_id;
  transaction_00.start_time = transaction.start_time;
  InitializeSecrets((SecretManager *)context,transaction_00);
  CreateSecretInput::CreateSecretInput(&function_input,in_RCX);
  if (function_input.provider._M_string_length == 0) {
    LookupTypeInternal(&secret_type,(SecretManager *)context,&function_input.type);
    ::std::__cxx11::string::_M_assign((string *)&function_input.provider);
    SecretType::~SecretType(&secret_type);
  }
  function_lookup =
       LookupFunctionInternal
                 ((SecretManager *)context,&function_input.type,&function_input.provider);
  if (function_lookup.ptr != (CreateSecretFunction *)0x0) {
    pCVar1 = optional_ptr<duckdb::CreateSecretFunction,_true>::operator->(&function_lookup);
    (*pCVar1->function)((ClientContext *)local_1e8,input);
    local_1f0 = (element_type *)local_1e8;
    if (local_1e8 != (undefined1  [8])0x0) {
      local_1e8 = (undefined1  [8])0x0;
      transaction_01.context.ptr = transaction.context.ptr;
      transaction_01.db.ptr = transaction.db.ptr;
      transaction_01.transaction.ptr = transaction.transaction.ptr;
      transaction_01.transaction_id = transaction.transaction_id;
      transaction_01.start_time = transaction.start_time;
      RegisterSecretInternal
                (this,transaction_01,
                 (unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
                  *)context,(OnCreateConflict)&local_1f0,in_RCX->on_conflict,
                 (string *)(ulong)in_RCX->persist_type);
      if (local_1f0 != (element_type *)0x0) {
        (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&((local_1f0->super_enable_shared_from_this<duckdb::ClientContext>).
                           __weak_this_.internal.
                           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext> + 8))->_M_pi
        )();
      }
      local_1f0 = (element_type *)0x0;
      if (local_1e8 != (undefined1  [8])0x0) {
        (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&((((enable_shared_from_this<duckdb::ClientContext> *)local_1e8)->
                           __weak_this_).internal.
                           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext> + 8))->_M_pi
        )();
      }
      CreateSecretInput::~CreateSecretInput(&function_input);
      return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
             (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)this;
    }
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&secret_type,
               "CreateSecretFunction for type: \'%s\' and provider: \'%s\' did not return a secret!"
               ,&local_1f1);
    ::std::__cxx11::string::string((string *)&local_190,(string *)in_RCX);
    ::std::__cxx11::string::string((string *)&local_1b0,(string *)&in_RCX->provider);
    InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
              (this_00,&secret_type.name,&local_190,&local_1b0);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ThrowProviderNotFoundError((SecretManager *)context,&in_RCX->type,&in_RCX->provider,false);
}

Assistant:

unique_ptr<SecretEntry> SecretManager::CreateSecret(ClientContext &context, const CreateSecretInput &input) {
	// Note that a context is required for CreateSecret, as the CreateSecretFunction expects one
	auto transaction = CatalogTransaction::GetSystemCatalogTransaction(context);
	InitializeSecrets(transaction);

	// Make a copy to set the provider to default if necessary
	auto function_input = input;
	if (function_input.provider.empty()) {
		auto secret_type = LookupTypeInternal(function_input.type);
		function_input.provider = secret_type.default_provider;
	}

	// Lookup function
	auto function_lookup = LookupFunctionInternal(function_input.type, function_input.provider);
	if (!function_lookup) {
		ThrowProviderNotFoundError(input.type, input.provider);
	}

	// Call the function
	auto secret = function_lookup->function(context, function_input);

	if (!secret) {
		throw InternalException("CreateSecretFunction for type: '%s' and provider: '%s' did not return a secret!",
		                        input.type, input.provider);
	}

	// Register the secret at the secret_manager
	return RegisterSecretInternal(transaction, std::move(secret), input.on_conflict, input.persist_type,
	                              input.storage_type);
}